

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O3

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeCylinderMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  float fVar1;
  aiVector3D *paVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  aiVector3D local_c8;
  aiVector3D local_b8;
  aiVector3D local_a8;
  aiMatrix4x4 local_98;
  aiMatrix3x3t<float> local_58;
  
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.z = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  fVar5 = axis->x;
  fVar6 = axis->y * 0.0;
  fVar7 = axis->z * 0.0;
  if (0.95 <= fVar5 + fVar6 + fVar7) {
    FindMeshCenter(mesh,&local_b8,&local_c8,&local_a8);
    if (mesh->mNumVertices != 0) {
      fVar5 = local_a8.x - local_c8.x;
      lVar4 = 4;
      uVar3 = 0;
      do {
        paVar2 = mesh->mVertices;
        *(float *)((long)&out->x + lVar4) =
             (*(float *)((long)paVar2 + lVar4 + -4) - local_c8.x) / fVar5;
        fVar6 = atan2f(*(float *)((long)&paVar2->y + lVar4) - local_b8.z,
                       *(float *)((long)&paVar2->x + lVar4) - local_b8.y);
        *(float *)((long)out + lVar4 + -4) = (fVar6 + 3.1415927) / 6.2831855;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar3 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= fVar7 + fVar5 * 0.0 + axis->y) {
    FindMeshCenter(mesh,&local_b8,&local_c8,&local_a8);
    if (mesh->mNumVertices != 0) {
      fVar5 = local_a8.y - local_c8.y;
      lVar4 = 4;
      uVar3 = 0;
      do {
        paVar2 = mesh->mVertices;
        *(float *)((long)&out->x + lVar4) =
             (*(float *)((long)&paVar2->x + lVar4) - local_c8.y) / fVar5;
        fVar6 = atan2f(*(float *)((long)paVar2 + lVar4 + -4) - local_b8.x,
                       *(float *)((long)&paVar2->y + lVar4) - local_b8.z);
        *(float *)((long)out + lVar4 + -4) = (fVar6 + 3.1415927) / 6.2831855;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar3 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= axis->z + fVar5 * 0.0 + fVar6) {
    FindMeshCenter(mesh,&local_b8,&local_c8,&local_a8);
    if (mesh->mNumVertices != 0) {
      fVar5 = local_a8.z - local_c8.z;
      lVar4 = 4;
      uVar3 = 0;
      do {
        paVar2 = mesh->mVertices;
        *(float *)((long)&out->x + lVar4) =
             (*(float *)((long)&paVar2->y + lVar4) - local_c8.z) / fVar5;
        fVar6 = atan2f(*(float *)((long)&paVar2->x + lVar4) - local_b8.y,
                       *(float *)((long)paVar2 + lVar4 + -4) - local_b8.x);
        *(float *)((long)out + lVar4 + -4) = (fVar6 + 3.1415927) / 6.2831855;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar3 < mesh->mNumVertices);
    }
  }
  else {
    local_58.a1 = 1.0;
    local_58.a2 = 0.0;
    local_58.a3 = 0.0;
    local_58.b1 = 0.0;
    local_58.b2 = 1.0;
    local_58.b3 = 0.0;
    local_58.c1 = 0.0;
    local_58.c2 = 0.0;
    local_58.c3 = 1.0;
    aiMatrix3x3t<float>::FromToMatrix
              (axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y,&local_58);
    local_98.a1 = local_58.a1;
    local_98.a2 = local_58.a2;
    local_98.a3 = local_58.a3;
    local_98.a4 = 0.0;
    local_98.b2 = local_58.b2;
    local_98.b1 = local_58.b1;
    local_98.b3 = local_58.b3;
    local_98.b4 = 0.0;
    local_98.c1 = local_58.c1;
    local_98.c2 = local_58.c2;
    local_98.c3 = local_58.c3;
    local_98.c4 = 0.0;
    local_98.d1 = 0.0;
    local_98.d2 = 0.0;
    local_98.d3 = 0.0;
    local_98.d4 = 1.0;
    FindMeshCenterTransformed(mesh,&local_b8,&local_c8,&local_a8,&local_98);
    if (mesh->mNumVertices != 0) {
      fVar5 = local_a8.y - local_c8.y;
      lVar4 = 4;
      uVar3 = 0;
      do {
        paVar2 = mesh->mVertices;
        fVar6 = *(float *)((long)paVar2 + lVar4 + -4);
        fVar7 = *(float *)((long)&paVar2->x + lVar4);
        fVar1 = *(float *)((long)&paVar2->y + lVar4);
        *(float *)((long)&out->x + lVar4) =
             ((local_98.b3 * fVar1 + local_98.b1 * fVar6 + local_98.b2 * fVar7 + local_98.b4) -
             local_c8.y) / fVar5;
        fVar6 = atan2f((local_98.a3 * fVar1 + local_98.a1 * fVar6 + local_98.a2 * fVar7 +
                       local_98.a4) - local_b8.x,
                       (fVar1 * local_98.c3 + fVar6 * local_98.c1 + fVar7 * local_98.c2 +
                       local_98.c4) - local_b8.z);
        *(float *)((long)out + lVar4 + -4) = (fVar6 + 3.1415927) / 6.2831855;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar3 < mesh->mNumVertices);
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeCylinderMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.x - min.x;

        // If the main axis is 'z', the z coordinate of a point 'p' is mapped
        // directly to the texture V axis. The other axis is derived from
        // the angle between ( p.x - c.x, p.y - c.y ) and (1,0), where
        // 'c' is the center point of the mesh.
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.x - min.x) / diff;
            uv.x = (std::atan2( pos.z - center.z, pos.y - center.y) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.y - min.y;

        // just the same ...
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.y - min.y) / diff;
            uv.x = (std::atan2( pos.x - center.x, pos.z - center.z) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.z - min.z;

        // just the same ...
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.z - min.z) / diff;
            uv.x = (std::atan2( pos.y - center.y, pos.x - center.x) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);
        FindMeshCenterTransformed(mesh, center, min, max,mTrafo);
        const ai_real diff = max.y - min.y;

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt){
            const aiVector3D pos = mTrafo* mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.y - min.y) / diff;
            uv.x = (std::atan2( pos.x - center.x, pos.z - center.z) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }

    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}